

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::
vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
::resize(vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
         *this,uint new_size,bool grow_hint)

{
  uint uVar1;
  
  uVar1 = this->m_size;
  if (uVar1 != new_size) {
    if (uVar1 <= new_size) {
      if (this->m_capacity < new_size) {
        increase_capacity(this,new_size,uVar1 + 1 == new_size || grow_hint,false);
        uVar1 = this->m_size;
      }
      helpers::
      construct_array<crnlib::hash_map<unsigned_int,unsigned_int,crnlib::hasher<unsigned_int>,crnlib::equal_to<unsigned_int>>::raw_node>
                (this->m_p + uVar1,new_size - uVar1);
    }
    this->m_size = new_size;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false)
        {
            if (m_size != new_size) {
                if (new_size < m_size)
                {
                    scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
                }
                else
                {
                    if (new_size > m_capacity)
                    {
                        increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);
                    }

                    scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
                }

                m_size = new_size;
            }
        }